

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestsupport_gui.cpp
# Opt level: O0

qreal QtGuiTest::scaleFactor(QWindow *window)

{
  long lVar1;
  bool bVar2;
  QDebug *o;
  char *in_RDI;
  long in_FS_OFFSET;
  qreal qVar3;
  QWindow *in_stack_00000008;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QLoggingCategory *in_stack_ffffffffffffff98;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *in_stack_ffffffffffffffa0;
  QMessageLogger *in_stack_ffffffffffffffb0;
  QWindow *in_stack_ffffffffffffffb8;
  QDebug local_30;
  QDebug local_28;
  QDebug local_20;
  char *t;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  t = &DAT_aaaaaaaaaaaaaaaa;
  lcQtGuiTest();
  anon_unknown.dwarf_91466c::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  while( true ) {
    bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                      ((QLoggingCategoryMacroHolder *)&stack0xffffffffffffffe8);
    if (!bVar2) break;
    anon_unknown.dwarf_91466c::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x425582);
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffffb0,in_RDI,(int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
               (char *)in_stack_ffffffffffffff98,(char *)0x425598);
    QMessageLogger::debug();
    o = QDebug::operator<<((QDebug *)in_stack_ffffffffffffffb8,t);
    QDebug::QDebug(&local_28,o);
    ::operator<<((QDebug *)window,in_stack_00000008);
    QDebug::~QDebug(&local_20);
    QDebug::~QDebug(&local_28);
    QDebug::~QDebug(&local_30);
  }
  qVar3 = QHighDpiScaling::factor<QWindow_const>(in_stack_ffffffffffffffb8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return qVar3;
  }
  __stack_chk_fail();
}

Assistant:

qreal QtGuiTest::scaleFactor(const QWindow *window)
{
    Q_ASSERT_X(window,
               Q_FUNC_INFO,
               "called with nullptr");

    deb << "Calculating scaling factor: " << window;
    return QHighDpiScaling::factor(window);
}